

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O0

void __thiscall MuxerManager::muxBlockFinished(MuxerManager *this,AbstractMuxer *muxer)

{
  bool bVar1;
  reference data;
  WriterData *i;
  iterator __end2;
  iterator __begin2;
  vector<WriterData,_std::allocator<WriterData>_> *__range2;
  AbstractMuxer *muxer_local;
  MuxerManager *this_local;
  
  if (muxer == this->m_subMuxer) {
    this->m_subBlockFinished = true;
  }
  else {
    this->m_mainBlockFinished = true;
  }
  if (((this->m_subBlockFinished & 1U) != 0) && ((this->m_mainBlockFinished & 1U) != 0)) {
    __end2 = std::vector<WriterData,_std::allocator<WriterData>_>::begin(&this->m_delayedData);
    i = (WriterData *)
        std::vector<WriterData,_std::allocator<WriterData>_>::end(&this->m_delayedData);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<WriterData_*,_std::vector<WriterData,_std::allocator<WriterData>_>_>
                                  *)&i);
      if (!bVar1) break;
      data = __gnu_cxx::
             __normal_iterator<WriterData_*,_std::vector<WriterData,_std::allocator<WriterData>_>_>
             ::operator*(&__end2);
      asyncWriteBlock(this,data);
      __gnu_cxx::
      __normal_iterator<WriterData_*,_std::vector<WriterData,_std::allocator<WriterData>_>_>::
      operator++(&__end2);
    }
    std::vector<WriterData,_std::allocator<WriterData>_>::clear(&this->m_delayedData);
    this->m_subBlockFinished = false;
    this->m_mainBlockFinished = false;
  }
  return;
}

Assistant:

void MuxerManager::muxBlockFinished(const AbstractMuxer* muxer)
{
    if (muxer == m_subMuxer)
        m_subBlockFinished = true;
    else
        m_mainBlockFinished = true;

    if (m_subBlockFinished && m_mainBlockFinished)
    {
        for (auto& i : m_delayedData) asyncWriteBlock(i);

        m_delayedData.clear();
        m_subBlockFinished = false;
        m_mainBlockFinished = false;
    }
}